

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addVariadicArgumentOperands
          (LLVMPointerGraphBuilder *this,Function *F,CallInst *CI,PSNode *arg)

{
  uint uVar1;
  uint idx;
  
  idx = *(int *)(F + 0x60) - 1;
  while( true ) {
    uVar1 = llvm::CallBase::arg_size((CallBase *)CI);
    if (uVar1 <= idx) break;
    addArgumentOperands(this,CI,arg,idx);
    idx = idx + 1;
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addVariadicArgumentOperands(
        const llvm::Function *F, const llvm::CallInst *CI, PSNode *arg) {
    for (unsigned idx = F->arg_size() - 1;
         idx < llvmutils::getNumArgOperands(CI); ++idx)
        addArgumentOperands(CI, arg, idx);
}